

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::RegisterFileLevelMetadata(DescriptorTable *table)

{
  char *__s;
  DescriptorPool *this;
  size_t sVar1;
  FileDescriptor *pFVar2;
  anon_class_8_1_a8aa2aee *in_RDX;
  long lVar3;
  long lVar4;
  string_view name;
  Message **defaults;
  anon_class_8_1_0e5317d0 local_30;
  Message **local_28;
  
  local_30.defaults = (Message ***)table;
  if ((table->once->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
    absl::lts_20250127::base_internal::
    CallOnceImpl<google::protobuf::internal::AssignDescriptors(google::protobuf::internal::DescriptorTable_const*)::__0>
              (&table->once->control_,(SchedulingMode)&local_30,in_RDX);
  }
  this = DescriptorPool::internal_generated_pool();
  __s = table->filename;
  sVar1 = strlen(__s);
  name._M_str = __s;
  name._M_len = sVar1;
  pFVar2 = DescriptorPool::FindFileByName(this,name);
  local_28 = table->default_instances;
  local_30.defaults = &local_28;
  if (0 < pFVar2->message_type_count_) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      cpp::
      VisitDescriptorsInFileOrder<google::protobuf::internal::RegisterFileLevelMetadata(google::protobuf::internal::DescriptorTable_const*)::__0>
                ((Descriptor *)(&pFVar2->message_types_->super_SymbolBase + lVar4),&local_30);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xa0;
    } while (lVar3 < pFVar2->message_type_count_);
  }
  return;
}

Assistant:

void RegisterFileLevelMetadata(const DescriptorTable* table) {
  AssignDescriptors(table);
  auto* file = DescriptorPool::internal_generated_pool()->FindFileByName(
      table->filename);
  auto defaults = table->default_instances;
  internal::cpp::VisitDescriptorsInFileOrder(file, [&](auto* desc) {
    MessageFactory::InternalRegisterGeneratedMessage(desc, *defaults);
    ++defaults;
    return std::false_type{};
  });
}